

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslScanContext.cpp
# Opt level: O0

TBuiltInVariable __thiscall
glslang::HlslScanContext::mapSemantic(HlslScanContext *this,char *upperCase)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_char_*const,_glslang::TBuiltInVariable>,_true> local_30;
  _Node_iterator_base<std::pair<const_char_*const,_glslang::TBuiltInVariable>,_true> local_28;
  iterator it;
  char *upperCase_local;
  HlslScanContext *this_local;
  
  it.super__Node_iterator_base<std::pair<const_char_*const,_glslang::TBuiltInVariable>,_true>._M_cur
       = (_Node_iterator_base<std::pair<const_char_*const,_glslang::TBuiltInVariable>,_true>)
         (_Node_iterator_base<std::pair<const_char_*const,_glslang::TBuiltInVariable>,_true>)
         upperCase;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_char_*,_glslang::TBuiltInVariable,_(anonymous_namespace)::str_hash,_(anonymous_namespace)::str_eq,_std::allocator<std::pair<const_char_*const,_glslang::TBuiltInVariable>_>_>
       ::find((unordered_map<const_char_*,_glslang::TBuiltInVariable,_(anonymous_namespace)::str_hash,_(anonymous_namespace)::str_eq,_std::allocator<std::pair<const_char_*const,_glslang::TBuiltInVariable>_>_>
               *)::(anonymous_namespace)::SemanticMap,(key_type *)&it);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<const_char_*,_glslang::TBuiltInVariable,_(anonymous_namespace)::str_hash,_(anonymous_namespace)::str_eq,_std::allocator<std::pair<const_char_*const,_glslang::TBuiltInVariable>_>_>
       ::end((unordered_map<const_char_*,_glslang::TBuiltInVariable,_(anonymous_namespace)::str_hash,_(anonymous_namespace)::str_eq,_std::allocator<std::pair<const_char_*const,_glslang::TBuiltInVariable>_>_>
              *)::(anonymous_namespace)::SemanticMap);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_char_*const,_glslang::TBuiltInVariable>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_char_*const,_glslang::TBuiltInVariable>,_false,_true>
                         *)&local_28);
    this_local._4_4_ = ppVar2->second;
  }
  else {
    this_local._4_4_ = EbvNone;
  }
  return this_local._4_4_;
}

Assistant:

glslang::TBuiltInVariable HlslScanContext::mapSemantic(const char* upperCase)
{
    auto it = SemanticMap.find(upperCase);
    if (it != SemanticMap.end())
        return it->second;
    else
        return glslang::EbvNone;
}